

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)11>_>
          (xpath_ast_node *this,xml_node_struct *ns,xml_node *xn,undefined8 param_4,byte once)

{
  bool bVar1;
  xml_node_struct *in_RAX;
  xpath_allocator *alloc;
  xml_node local_38;
  
  if (((long *)xn)[1] == 0) {
    local_38._root = xn->_root;
  }
  else {
    local_38._root = in_RAX;
    xml_node::xml_node(&local_38);
  }
  if (local_38._root != (xml_node_struct *)0x0) {
    if (((long *)xn)[1] != 0) {
      xml_node::xml_node(&local_38);
      xn = &local_38;
    }
    alloc = *(xpath_allocator **)xn;
    do {
      alloc = (xpath_allocator *)alloc[1]._error;
      if (alloc[2]._root == (xpath_memory_block *)0x0) {
        return;
      }
      bVar1 = step_push((xpath_ast_node *)(ulong)(byte)this->_test,
                        (xpath_node_set_raw *)(this->_data).variable,ns,alloc);
    } while ((bVar1 & once) != 1);
  }
  return;
}

Assistant:

void step_fill(xpath_node_set_raw& ns, const xpath_node& xn, xpath_allocator* alloc, bool once, T v)
		{
			const axis_t axis = T::axis;
			const bool axis_has_attributes = (axis == axis_ancestor || axis == axis_ancestor_or_self || axis == axis_descendant_or_self || axis == axis_following || axis == axis_parent || axis == axis_preceding || axis == axis_self);

			if (xn.node())
				step_fill(ns, xn.node().internal_object(), alloc, once, v);
			else if (axis_has_attributes && xn.attribute() && xn.parent())
				step_fill(ns, xn.attribute().internal_object(), xn.parent().internal_object(), alloc, once, v);
		}